

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O1

void get_vault_monsters(chunk *c,char *racial_symbol,char *vault_type,char *data,wchar_t y1,
                       wchar_t y2,wchar_t x1,wchar_t x2)

{
  char cVar1;
  char *pcVar2;
  monster_race *pmVar3;
  loc grid;
  wchar_t wVar4;
  long lVar5;
  char *pcVar6;
  wchar_t generated_level;
  wchar_t x;
  bool bVar7;
  
  cVar1 = *racial_symbol;
  if (cVar1 != '\0') {
    lVar5 = 0;
    do {
      allow_unique = true;
      pcVar2 = format("%c",(ulong)(uint)(int)cVar1);
      my_strcpy(base_d_char,pcVar2,0xf);
      wVar4 = c->depth;
      select_current_level = wVar4;
      pcVar2 = strstr(vault_type,"Lesser vault");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strstr(vault_type,"Medium vault");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strstr(vault_type,"Greater vault");
          generated_level = wVar4 + L'\x06';
          if (pcVar2 == (char *)0x0) {
            generated_level = wVar4;
          }
        }
        else {
          generated_level = wVar4 + L'\x04';
        }
      }
      else {
        generated_level = wVar4 + L'\x02';
      }
      get_mon_num_prep(mon_select);
      pmVar3 = get_mon_num(generated_level,c->depth);
      pcVar2 = data;
      wVar4 = y1;
      if (pmVar3 != (monster_race *)0x0 && y1 <= y2) {
        do {
          pcVar6 = pcVar2;
          x = x1;
          if (x1 <= x2) {
            do {
              if (*pcVar6 == racial_symbol[lVar5]) {
                grid = (loc)loc(x,wVar4);
                pick_and_place_monster(c,grid,generated_level,false,false,'\v');
              }
              x = x + L'\x01';
              pcVar6 = pcVar6 + 1;
            } while (x2 + L'\x01' != x);
            pcVar2 = pcVar2 + (ulong)(uint)(x2 - x1) + 1;
          }
          bVar7 = wVar4 != y2;
          wVar4 = wVar4 + L'\x01';
        } while (bVar7);
      }
      cVar1 = racial_symbol[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (cVar1 != '\0');
  }
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  return;
}

Assistant:

void get_vault_monsters(struct chunk *c, char racial_symbol[], char *vault_type,
						const char *data, int y1, int y2, int x1, int x2)
{
	int i, y, x, depth;
	const char *t;

	for (i = 0; racial_symbol[i] != '\0'; i++) {
		/* Require correct race, allow uniques. */
		allow_unique = true;
		my_strcpy(base_d_char, format("%c", racial_symbol[i]),
			sizeof(base_d_char));
		select_current_level = c->depth;

		/* Determine level of monster */
		if (strstr(vault_type, "Lesser vault"))
			depth = c->depth + 2;
		else if (strstr(vault_type, "Medium vault"))
			depth = c->depth + 4;
		else if (strstr(vault_type, "Greater vault"))
			depth = c->depth + 6;
		else
			depth = c->depth;

		/* Prepare allocation table */
		get_mon_num_prep(mon_select);

		/* Build the monster probability table. */
		if (!get_mon_num(depth, c->depth))
			continue;


		/* Place the monsters */
		for (t = data, y = y1; y <= y2; y++) {
			for (x = x1; x <= x2; x++, t++) {
				if (*t == racial_symbol[i]) {
					/* Place a monster */
					pick_and_place_monster(c, loc(x, y), depth, false,
																false, ORIGIN_DROP_SPECIAL);
				}
			}
		}
	}

	/* Clear any current monster restrictions. */
	get_mon_num_prep(NULL);
}